

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

void __thiscall
cmListFileFunction::cmListFileFunction
          (cmListFileFunction *this,string *name,long line,long lineEnd,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  undefined1 local_40 [24];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  long lineEnd_local;
  long line_local;
  string *name_local;
  cmListFileFunction *this_local;
  
  local_40._16_8_ = args;
  args_local = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)lineEnd;
  lineEnd_local = line;
  line_local = (long)name;
  name_local = (string *)this;
  std::
  make_shared<cmListFileFunction::Implementation,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (long *)name,&lineEnd_local,
             (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&args_local);
  std::shared_ptr<cmListFileFunction::Implementation_const>::
  shared_ptr<cmListFileFunction::Implementation,void>
            ((shared_ptr<cmListFileFunction::Implementation_const> *)this,
             (shared_ptr<cmListFileFunction::Implementation> *)local_40);
  std::shared_ptr<cmListFileFunction::Implementation>::~shared_ptr
            ((shared_ptr<cmListFileFunction::Implementation> *)local_40);
  return;
}

Assistant:

cmListFileFunction(std::string name, long line, long lineEnd,
                     std::vector<cmListFileArgument> args)
    : Impl{ std::make_shared<Implementation>(std::move(name), line, lineEnd,
                                             std::move(args)) }
  {
  }